

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTrace.cpp
# Opt level: O0

bool idx2::PrintStacktrace(printer *Pr)

{
  int iVar1;
  char **ppcVar2;
  FILE *__stream;
  char *pcVar3;
  int Written_5;
  int Written_4;
  char Buffer_1 [1024];
  FILE *F;
  char Syscom [1024];
  int BufLen;
  int Written_3;
  int Written_2;
  char *Ret;
  char *pcStack_2f8;
  int Status;
  char *P;
  char *EndOffset;
  char *BeginOffset;
  char *BeginName;
  char **ppcStack_2d0;
  int I;
  char *FuncName;
  char Buffer [128];
  undefined8 local_240;
  size_t FuncNameSize;
  char **SymbolList;
  int Written_1;
  int AddrLen;
  void *AddrList [64];
  int MaxFrames;
  int Written;
  printer *Pr_local;
  
  if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
    if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                    ,0x6c,"bool idx2::PrintStacktrace(printer *)");
    }
    fprintf((FILE *)Pr->File,"Stack trace:\n");
  }
  else {
    if (Pr->Size < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                    ,0x6c,"bool idx2::PrintStacktrace(printer *)");
    }
    iVar1 = snprintf(Pr->Buf,(long)Pr->Size,"Stack trace:\n");
    Pr->Buf = Pr->Buf + iVar1;
    if (Pr->Size <= iVar1) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                    ,0x6c,"bool idx2::PrintStacktrace(printer *)");
    }
    Pr->Size = Pr->Size - iVar1;
  }
  SymbolList._4_4_ = backtrace(&Written_1,0x40);
  if (SymbolList._4_4_ == 0) {
    if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
      if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
        __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                      ,0x73,"bool idx2::PrintStacktrace(printer *)");
      }
      fprintf((FILE *)Pr->File,"  <empty, possibly corrupt>\n");
    }
    else {
      if (Pr->Size < 2) {
        __assert_fail("false && \"buffer too small\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                      ,0x73,"bool idx2::PrintStacktrace(printer *)");
      }
      SymbolList._0_4_ = snprintf(Pr->Buf,(long)Pr->Size,"  <empty, possibly corrupt>\n");
      Pr->Buf = Pr->Buf + (int)SymbolList;
      if (Pr->Size <= (int)SymbolList) {
        __assert_fail("false && \"buffer overflow?\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                      ,0x73,"bool idx2::PrintStacktrace(printer *)");
      }
      Pr->Size = Pr->Size - (int)SymbolList;
    }
    Pr_local._7_1_ = false;
  }
  else {
    FuncNameSize = backtrace_symbols(&Written_1,SymbolList._4_4_);
    local_240 = 0x80;
    ppcStack_2d0 = &FuncName;
    for (BeginName._4_4_ = 1; BeginName._4_4_ < SymbolList._4_4_;
        BeginName._4_4_ = BeginName._4_4_ + 1) {
      BeginOffset = (char *)0x0;
      EndOffset = (char *)0x0;
      P = (char *)0x0;
      for (pcStack_2f8 = *(char **)(FuncNameSize + (long)BeginName._4_4_ * 8); *pcStack_2f8 != '\0';
          pcStack_2f8 = pcStack_2f8 + 1) {
        if (*pcStack_2f8 == '(') {
          BeginOffset = pcStack_2f8;
        }
        else if (*pcStack_2f8 == '+') {
          EndOffset = pcStack_2f8;
        }
        else if ((*pcStack_2f8 == ')') && (EndOffset != (char *)0x0)) {
          P = pcStack_2f8;
          break;
        }
      }
      if ((((BeginOffset == (char *)0x0) || (EndOffset == (char *)0x0)) || (P == (char *)0x0)) ||
         (EndOffset <= BeginOffset)) {
        if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
          if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
            __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0xb0,"bool idx2::PrintStacktrace(printer *)");
          }
          fprintf((FILE *)Pr->File,"  %s\n",
                  *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8));
        }
        else {
          if (Pr->Size < 2) {
            __assert_fail("false && \"buffer too small\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0xb0,"bool idx2::PrintStacktrace(printer *)");
          }
          iVar1 = snprintf(Pr->Buf,(long)Pr->Size,"  %s\n",
                           *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8));
          Pr->Buf = Pr->Buf + iVar1;
          if (Pr->Size <= iVar1) {
            __assert_fail("false && \"buffer overflow?\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0xb0,"bool idx2::PrintStacktrace(printer *)");
          }
          Pr->Size = Pr->Size - iVar1;
        }
      }
      else {
        pcVar3 = BeginOffset + 1;
        *BeginOffset = '\0';
        *EndOffset = '\0';
        *P = '\0';
        EndOffset = EndOffset + 1;
        BeginOffset = pcVar3;
        ppcVar2 = (char **)__cxa_demangle(pcVar3,ppcStack_2d0,&local_240,(long)&Ret + 4);
        if (Ret._4_4_ == 0) {
          ppcStack_2d0 = ppcVar2;
          if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
            if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
              __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0x9a,"bool idx2::PrintStacktrace(printer *)");
            }
            fprintf((FILE *)Pr->File,"  %s: %s +%s [%p]\n",
                    *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8),ppcVar2,EndOffset,
                    *(undefined8 *)(&Written_1 + (long)BeginName._4_4_ * 2));
          }
          else {
            if (Pr->Size < 2) {
              __assert_fail("false && \"buffer too small\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0x9a,"bool idx2::PrintStacktrace(printer *)");
            }
            iVar1 = snprintf(Pr->Buf,(long)Pr->Size,"  %s: %s +%s [%p]\n",
                             *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8),ppcVar2,
                             EndOffset,*(undefined8 *)(&Written_1 + (long)BeginName._4_4_ * 2));
            Pr->Buf = Pr->Buf + iVar1;
            if (Pr->Size <= iVar1) {
              __assert_fail("false && \"buffer overflow?\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0x9a,"bool idx2::PrintStacktrace(printer *)");
            }
            Pr->Size = Pr->Size - iVar1;
          }
        }
        else if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
          if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
            __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0x9e,"bool idx2::PrintStacktrace(printer *)");
          }
          fprintf((FILE *)Pr->File,"  %s: %s() +%s [%p]\n",
                  *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8),BeginOffset,EndOffset,
                  *(undefined8 *)(&Written_1 + (long)BeginName._4_4_ * 2));
        }
        else {
          if (Pr->Size < 2) {
            __assert_fail("false && \"buffer too small\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0x9e,"bool idx2::PrintStacktrace(printer *)");
          }
          iVar1 = snprintf(Pr->Buf,(long)Pr->Size,"  %s: %s() +%s [%p]\n",
                           *(undefined8 *)(FuncNameSize + (long)BeginName._4_4_ * 8),BeginOffset,
                           EndOffset,*(undefined8 *)(&Written_1 + (long)BeginName._4_4_ * 2));
          Pr->Buf = Pr->Buf + iVar1;
          if (Pr->Size <= iVar1) {
            __assert_fail("false && \"buffer overflow?\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0x9e,"bool idx2::PrintStacktrace(printer *)");
          }
          Pr->Size = Pr->Size - iVar1;
        }
        Syscom[0x3fc] = '\0';
        Syscom[0x3fd] = '\x04';
        Syscom[0x3fe] = '\0';
        Syscom[0x3ff] = '\0';
        snprintf((char *)&F,0x400,"addr2line %p -e %s",
                 *(undefined8 *)(&Written_1 + (long)BeginName._4_4_ * 2),"main");
        __stream = popen((char *)&F,"r");
        if (__stream != (FILE *)0x0) {
          memset(&Written_5,0,0x400);
          while (pcVar3 = fgets((char *)&Written_5,0x400,__stream), pcVar3 != (char *)0x0) {
            if ((Pr->Buf == (char *)0x0) || (Pr->File != (FILE *)0x0)) {
              if ((Pr->Buf != (char *)0x0) || (Pr->File == (FILE *)0x0)) {
                __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                              ,0xaa,"bool idx2::PrintStacktrace(printer *)");
              }
              fprintf((FILE *)Pr->File,"    %s",&Written_5);
            }
            else {
              if (Pr->Size < 2) {
                __assert_fail("false && \"buffer too small\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                              ,0xaa,"bool idx2::PrintStacktrace(printer *)");
              }
              iVar1 = snprintf(Pr->Buf,(long)Pr->Size,"    %s",&Written_5);
              Pr->Buf = Pr->Buf + iVar1;
              if (Pr->Size <= iVar1) {
                __assert_fail("false && \"buffer overflow?\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                              ,0xaa,"bool idx2::PrintStacktrace(printer *)");
              }
              Pr->Size = Pr->Size - iVar1;
            }
          }
          pclose(__stream);
        }
      }
    }
    free((void *)FuncNameSize);
    Pr_local._7_1_ = true;
  }
  return Pr_local._7_1_;
}

Assistant:

bool
PrintStacktrace(printer* Pr)
{
  idx2_Print(Pr, "Stack trace:\n");
  constexpr int MaxFrames = 63;
  void* AddrList[MaxFrames + 1]; // Storage array for stack trace address data
  /* Retrieve current stack addresses */
  int AddrLen = backtrace(AddrList, sizeof(AddrList) / sizeof(void*));
  if (AddrLen == 0)
  {
    idx2_Print(Pr, "  <empty, possibly corrupt>\n");
    return false;
  }
  /* Resolve addresses into strings containing "filename(function+address)", */
  char** SymbolList = backtrace_symbols(AddrList, AddrLen);
  size_t FuncNameSize = 128;
  char Buffer[128];
  char* FuncName = Buffer;
  // iterate over the returned symbol lines (skip the first)
  for (int I = 1; I < AddrLen; ++I)
  {
    // fprintf(stderr, "%s\n", SymbolList[I]);
    char *BeginName = 0, *BeginOffset = 0, *EndOffset = 0;
    /* Find parentheses and +address offset surrounding the mangled name:
    e.g., ./module(function+0x15c) [0x8048a6d] */
    for (char* P = SymbolList[I]; *P; ++P)
    {
      if (*P == '(')
        BeginName = P;
      else if (*P == '+')
        BeginOffset = P;
      else if (*P == ')' && BeginOffset)
      {
        EndOffset = P;
        break;
      }
    }
    if (BeginName && BeginOffset && EndOffset && BeginName < BeginOffset)
    {
      *BeginName++ = '\0';
      *BeginOffset++ = '\0';
      *EndOffset = '\0';
      /* mangled name is now in [BeginName, BeginOffset) and caller offset in
[BeginOffset, EndOffset) */
      int Status;
      char* Ret = abi::__cxa_demangle(BeginName, FuncName, &FuncNameSize, &Status);
      if (Status == 0)
      {
        FuncName = Ret; // use possibly realloc()-ed string
        idx2_Print(Pr, "  %s: %s +%s [%p]\n", SymbolList[I], FuncName, BeginOffset, AddrList[I]);
      }
      else
      { // demangling failed
        idx2_Print(Pr, "  %s: %s() +%s [%p]\n", SymbolList[I], BeginName, BeginOffset, AddrList[I]);
      }
      /* get file names and line numbers using addr2line */
      constexpr int BufLen = 1024;
      char Syscom[BufLen];
      // last parameter is the name of this app
      snprintf(Syscom, BufLen, "addr2line %p -e %s", AddrList[I], "main");
      FILE* F = popen(Syscom, "r");
      if (F)
      {
        char Buffer[BufLen] = { 0 };
        while (fgets(Buffer, sizeof(Buffer), F))
          idx2_Print(Pr, "    %s", Buffer);
        pclose(F);
      }
    }
    else
    { // couldn't parse the line? print the whole line.
      idx2_Print(Pr, "  %s\n", SymbolList[I]);
    }
  }
  free(SymbolList);
  return true;
}